

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

SharedPtr<deqp::egl::GLES2ThreadTest::Program> __thiscall
deqp::egl::GLES2ThreadTest::GLES2ResourceManager::popProgram(GLES2ResourceManager *this,int index)

{
  reference other;
  int in_EDX;
  SharedPtrStateBase *extraout_RDX;
  undefined4 in_register_00000034;
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>_>_>
  *this_00;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> SVar1;
  __normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>_*,_std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>_>_>_>
  local_38;
  __normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>_*,_std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>_>_>_>
  local_30;
  const_iterator local_28;
  undefined1 local_1d;
  int local_1c;
  long lStack_18;
  int index_local;
  GLES2ResourceManager *this_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> *program;
  
  lStack_18 = CONCAT44(in_register_00000034,index);
  local_1d = 0;
  this_00 = (vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>_>_>
             *)(lStack_18 + 0x48);
  local_1c = in_EDX;
  this_local = this;
  other = std::
          vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>_>_>
          ::operator[](this_00,(long)in_EDX);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)this,other);
  local_38._M_current =
       (SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)
       std::
       vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>_>_>
       ::begin(this_00);
  local_30 = __gnu_cxx::
             __normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>_*,_std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>_>_>_>
             ::operator+(&local_38,(long)local_1c);
  __gnu_cxx::
  __normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>const*,std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>,std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>>>>
  ::__normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>*>
            ((__normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>const*,std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>,std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>>>>
              *)&local_28,&local_30);
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>_>_>
  ::erase(this_00,local_28);
  SVar1.m_state = extraout_RDX;
  SVar1.m_ptr = (Program *)this;
  return SVar1;
}

Assistant:

SharedPtr<Program> GLES2ResourceManager::popProgram (int index)
{
	SharedPtr<Program> program = m_programs[index];

	m_programs.erase(m_programs.begin() + index);

	return program;
}